

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrQuerySpatialAnchorsAsyncML
                   (XrSpatialAnchorsStorageML storage,
                   XrSpatialAnchorsQueryInfoBaseHeaderML *queryInfo,XrFutureEXT *future)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  XrSpatialAnchorsStorageML_T *in_stack_fffffffffffffd68;
  string local_290;
  string local_270;
  XrSpatialAnchorsStorageML storage_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_230;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3b9cf0c8;
  storage_local = storage;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSpatialAnchorsStorageML_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&storage_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSpatialAnchorsStorageMLHandle(&storage_local);
  if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSpatialAnchorsStorageML handle \"storage\" ");
    HandleToHexString<XrSpatialAnchorsStorageML_T*>(in_stack_fffffffffffffd68);
    std::operator<<((ostream *)&oss,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string
              ((string *)&local_290,"VUID-xrQuerySpatialAnchorsAsyncML-storage-parameter",
               (allocator *)&stack0xfffffffffffffd6e);
    std::__cxx11::string::string
              ((string *)&local_270,"xrQuerySpatialAnchorsAsyncML",
               (allocator *)&stack0xfffffffffffffd6f);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_290,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
    goto LAB_001f0cb8;
  }
  pVar3 = HandleInfo<XrSpatialAnchorsStorageML_T_*>::getWithInstanceInfo
                    (&g_spatialanchorsstorageml_info,storage_local);
  instance_info = pVar3.second;
  if (queryInfo == (XrSpatialAnchorsQueryInfoBaseHeaderML *)0x0) {
    std::__cxx11::string::string
              ((string *)&oss,"VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
               (allocator *)&local_230);
    std::__cxx11::string::string
              ((string *)&local_290,"xrQuerySpatialAnchorsAsyncML",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1c8,&objects_info);
    std::__cxx11::string::string
              ((string *)&local_270,
               "Invalid NULL for XrSpatialAnchorsQueryInfoBaseHeaderML \"queryInfo\" which is not optional and must be non-NULL"
               ,(allocator *)&stack0xfffffffffffffd6f);
    CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1c8,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    this = &local_1c8;
LAB_001f0c99:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
  }
  else {
    if (queryInfo->type != XR_TYPE_SPATIAL_ANCHORS_QUERY_INFO_RADIUS_ML) {
LAB_001f0b0e:
      std::__cxx11::string::string
                ((string *)&oss,"xrQuerySpatialAnchorsAsyncML",(allocator *)&local_290);
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,false,queryInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 != XR_SUCCESS) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                   (allocator *)&local_230);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrQuerySpatialAnchorsAsyncML",
                   (allocator *)&stack0xfffffffffffffd6e);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1f8,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,
                   "Command xrQuerySpatialAnchorsAsyncML param queryInfo is invalid",
                   (allocator *)&stack0xfffffffffffffd6f);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1f8,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
        ~_Vector_base(&local_1f8);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&oss);
        goto LAB_001f0cb8;
      }
      XVar2 = XR_SUCCESS;
      if (future != (XrFutureEXT *)0x0) goto LAB_001f0cb8;
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrQuerySpatialAnchorsAsyncML-future-parameter",
                 (allocator *)&local_230);
      std::__cxx11::string::string
                ((string *)&local_290,"xrQuerySpatialAnchorsAsyncML",
                 (allocator *)&stack0xfffffffffffffd6e);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Invalid NULL for XrFutureEXT \"future\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd6f);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_210;
      goto LAB_001f0c99;
    }
    std::__cxx11::string::string
              ((string *)&oss,"xrQuerySpatialAnchorsAsyncML",(allocator *)&local_290);
    XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,
                             (XrSpatialAnchorsQueryInfoRadiusML *)queryInfo);
    std::__cxx11::string::~string((string *)&oss);
    if (XVar2 == XR_SUCCESS) goto LAB_001f0b0e;
    std::__cxx11::string::string
              ((string *)&oss,"Command xrQuerySpatialAnchorsAsyncML param queryInfo",
               (allocator *)&local_290);
    std::__cxx11::string::append((char *)&oss);
    std::__cxx11::string::string
              ((string *)&local_290,"VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
               (allocator *)&local_230);
    std::__cxx11::string::string
              ((string *)&local_270,"xrQuerySpatialAnchorsAsyncML",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,&objects_info);
    CoreValidLogMessage(instance_info,&local_290,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,(string *)&oss);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&oss);
  XVar2 = XR_ERROR_VALIDATION_FAILURE;
LAB_001f0cb8:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrQuerySpatialAnchorsAsyncML(
XrSpatialAnchorsStorageML storage,
const XrSpatialAnchorsQueryInfoBaseHeaderML* queryInfo,
XrFutureEXT* future) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(storage, XR_OBJECT_TYPE_SPATIAL_ANCHORS_STORAGE_ML);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpatialAnchorsStorageMLHandle(&storage);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpatialAnchorsStorageML handle \"storage\" ";
                oss << HandleToHexString(storage);
                CoreValidLogMessage(nullptr, "VUID-xrQuerySpatialAnchorsAsyncML-storage-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_spatialanchorsstorageml_info.getWithInstanceInfo(storage);
        GenValidUsageXrHandleInfo *gen_spatialanchorsstorageml_info = info_with_instance.first;
        (void)gen_spatialanchorsstorageml_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == queryInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML", objects_info,
                                "Invalid NULL for XrSpatialAnchorsQueryInfoBaseHeaderML \"queryInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate if XrSpatialAnchorsQueryInfoBaseHeaderML is a child structure of type XrSpatialAnchorsQueryInfoRadiusML and it is valid
        {
            const XrSpatialAnchorsQueryInfoRadiusML* new_spatialanchorsqueryinforadiusml_value = reinterpret_cast<const XrSpatialAnchorsQueryInfoRadiusML*>(queryInfo);
            if (new_spatialanchorsqueryinforadiusml_value->type == XR_TYPE_SPATIAL_ANCHORS_QUERY_INFO_RADIUS_ML) {
                xr_result = ValidateXrStruct(gen_instance_info, "xrQuerySpatialAnchorsAsyncML",
                                                                objects_info,false, true, new_spatialanchorsqueryinforadiusml_value);
                if (XR_SUCCESS != xr_result) {
                    std::string error_message = "Command xrQuerySpatialAnchorsAsyncML param queryInfo";
                    error_message += " is invalid";
                    CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML",
                                        objects_info,
                                        error_message);
                    return XR_ERROR_VALIDATION_FAILURE;
                }
            }
        }
        // Validate that the base-structure XrSpatialAnchorsQueryInfoBaseHeaderML is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrQuerySpatialAnchorsAsyncML", objects_info,
                                                        true, true, queryInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-queryInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML",
                                objects_info,
                                "Command xrQuerySpatialAnchorsAsyncML param queryInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == future) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrQuerySpatialAnchorsAsyncML-future-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrQuerySpatialAnchorsAsyncML", objects_info,
                                "Invalid NULL for XrFutureEXT \"future\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrQuerySpatialAnchorsAsyncML-future-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}